

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void FindRulePrecedences(lemon *xp)

{
  symbol *psVar1;
  bool bVar2;
  symbol *sp;
  int j;
  int i;
  rule *rp;
  lemon *xp_local;
  
  rp = xp->rule;
  do {
    if (rp == (rule *)0x0) {
      return;
    }
    if (rp->precsym == (symbol *)0x0) {
      i = 0;
      while( true ) {
        bVar2 = false;
        if (i < rp->nrhs) {
          bVar2 = rp->precsym == (symbol *)0x0;
        }
        if (!bVar2) break;
        psVar1 = rp->rhs[i];
        if (psVar1->type == MULTITERMINAL) {
          for (j = 0; j < psVar1->nsubsym; j = j + 1) {
            if (-1 < psVar1->subsym[j]->prec) {
              rp->precsym = psVar1->subsym[j];
              break;
            }
          }
        }
        else if (-1 < psVar1->prec) {
          rp->precsym = rp->rhs[i];
        }
        i = i + 1;
      }
    }
    rp = rp->next;
  } while( true );
}

Assistant:

void FindRulePrecedences(struct lemon *xp)
{
  struct rule *rp;
  for(rp=xp->rule; rp; rp=rp->next){
    if( rp->precsym==0 ){
      int i, j;
      for(i=0; i<rp->nrhs && rp->precsym==0; i++){
        struct symbol *sp = rp->rhs[i];
        if( sp->type==MULTITERMINAL ){
          for(j=0; j<sp->nsubsym; j++){
            if( sp->subsym[j]->prec>=0 ){
              rp->precsym = sp->subsym[j];
              break;
            }
          }
        }else if( sp->prec>=0 ){
          rp->precsym = rp->rhs[i];
        }
      }
    }
  }
  return;
}